

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecompbase.cpp
# Opt level: O2

void __thiscall lzham::CLZDecompBase::init_position_slots(CLZDecompBase *this,uint dict_size_log2)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar2 = 1 << ((byte)dict_size_log2 & 0x1f);
  this->m_dict_size_log2 = dict_size_log2;
  this->m_dict_size = uVar2;
  uVar3 = 0;
  for (uVar1 = 0; uVar1 < 0x80; uVar1 = uVar1 + 2) {
    this->m_lzx_position_extra_bits[uVar1] = (uint8)uVar3;
    this->m_lzx_position_extra_bits[uVar1 + 1] = (uint8)uVar3;
    uVar3 = uVar3 + (uVar3 < 0x19 && uVar1 != 0);
  }
  uVar4 = 0;
  for (lVar5 = -0x80; lVar5 != 0; lVar5 = lVar5 + 1) {
    this->m_lzx_position_extra_mask[lVar5] = uVar4;
    *(int *)(this->m_lzx_position_extra_bits + lVar5 * 4) =
         ~(-1 << (*(byte *)((long)this[1].m_lzx_position_base + lVar5 + -0xc) & 0x1f));
    uVar4 = uVar4 + (1 << (*(byte *)((long)this[1].m_lzx_position_base + lVar5 + -0xc) & 0x1f));
  }
  this->m_num_lzx_slots = 0;
  uVar3 = uVar2 - 1;
  lVar5 = -0x80;
  while( true ) {
    if (lVar5 == 0) {
      lzham_assert("m_num_lzx_slots",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_lzdecompbase.cpp"
                   ,0x2b);
      return;
    }
    if ((this->m_lzx_position_extra_mask[lVar5] <= uVar3) &&
       (uVar3 < (1 << (*(byte *)((long)this[1].m_lzx_position_base + lVar5 + -0xc) & 0x1f)) +
                this->m_lzx_position_extra_mask[lVar5])) break;
    lVar5 = lVar5 + 1;
  }
  this->m_num_lzx_slots = (int)lVar5 + 0x81;
  return;
}

Assistant:

void CLZDecompBase::init_position_slots(uint dict_size_log2)
   {
      m_dict_size_log2 = dict_size_log2;
      m_dict_size = 1U << dict_size_log2;
      
      int i, j;
      for (i = 0, j = 0; i < cLZXMaxPositionSlots; i += 2) 
      {
         m_lzx_position_extra_bits[i] = (uint8)j;
         m_lzx_position_extra_bits[i + 1] = (uint8)j; 

         if ((i != 0) && (j < 25))  
            j++; 
      }

      for (i = 0, j = 0; i < cLZXMaxPositionSlots; i++) 
      {
         m_lzx_position_base[i] = j;
         m_lzx_position_extra_mask[i] = (1 << m_lzx_position_extra_bits[i]) - 1;
         j += (1 << m_lzx_position_extra_bits[i]);
      }

      m_num_lzx_slots = 0;         
      
      const uint largest_dist = m_dict_size - 1;
      for (int i = 0; i < cLZXMaxPositionSlots; i++)
      {
         if ( (largest_dist >= m_lzx_position_base[i]) &&
              (largest_dist < (m_lzx_position_base[i] + (1 << m_lzx_position_extra_bits[i])) ) )
         {
            m_num_lzx_slots = i + 1;
            break;
         }              
      }
      
      LZHAM_VERIFY(m_num_lzx_slots);
   }